

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSymbol.cpp
# Opt level: O0

Var Js::JavascriptSymbol::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags CVar3;
  BOOL BVar4;
  ScriptContext *pSVar5;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptLibrary *pJVar8;
  JavascriptSymbol *pJVar9;
  JavascriptString *local_60;
  JavascriptString *description;
  ScriptContext *local_48;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0x12,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  local_48 = RecyclableObject::GetScriptContext(function);
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSymbol.cpp"
                                ,0x15,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  Arguments::Arguments((Arguments *)&description,(Arguments *)&scriptContext);
  Js::JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)&description);
  CVar3 = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                        (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                         CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                        CallFlags_New),CallFlags_New);
  if (CVar3 != CallFlags_None) {
    JavascriptError::ThrowTypeError(local_48,-0x7ff5ebf5,L"Symbol");
  }
  if (((uint)scriptContext & 0xffffff) != 1 && ((ulong)scriptContext & 0xffffff) != 0) {
    pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
    BVar4 = Js::JavascriptOperators::IsUndefined(pvVar7);
    if (BVar4 == 0) {
      pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,1);
      local_60 = JavascriptConversion::ToString(pvVar7,local_48);
      goto LAB_0133a308;
    }
  }
  pJVar8 = ScriptContext::GetLibrary(local_48);
  local_60 = JavascriptLibrary::GetEmptyString(pJVar8);
LAB_0133a308:
  pJVar8 = ScriptContext::GetLibrary(local_48);
  pJVar9 = JavascriptLibrary::CreateSymbol(pJVar8,local_60);
  return pJVar9;
}

Assistant:

Var JavascriptSymbol::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Symbol, scriptContext);

        // SkipDefaultNewObject function flag should have prevented the default object from
        // being created, except when call true a host dispatch.
        JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

        if (callInfo.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Symbol"));
        }

        JavascriptString* description;

        if (args.Info.Count > 1 && !JavascriptOperators::IsUndefined(args[1]))
        {
            description = JavascriptConversion::ToString(args[1], scriptContext);
        }
        else
        {
            description = scriptContext->GetLibrary()->GetEmptyString();
        }

        return scriptContext->GetLibrary()->CreateSymbol(description);
    }